

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaWriter::writeVisualScenes(ofstream *out,Scene *scene)

{
  bool bVar1;
  ostream *poVar2;
  reference ppSVar3;
  long local_58;
  Mesh *mesh;
  SceneObject *o;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  int nNodes;
  int nMeshes;
  Scene *scene_local;
  ofstream *out_local;
  
  poVar2 = std::operator<<((ostream *)out,"   <library_visual_scenes>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)out,"      <visual_scene id=\"ScottyScene\">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __range2._4_4_ = 0;
  __range2._0_4_ = 0;
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&scene->objects);
  o = (SceneObject *)
      std::
      set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::end(&scene->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&o);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    if (*ppSVar3 == (SceneObject *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(*ppSVar3,&DynamicScene::SceneObject::typeinfo,
                                &DynamicScene::Mesh::typeinfo,0);
    }
    if (local_58 != 0) {
      __range2._4_4_ = __range2._4_4_ + 1;
      __range2._0_4_ = (int)__range2 + 1;
      poVar2 = std::operator<<((ostream *)out,"         <node id=\"N");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__range2);
      poVar2 = std::operator<<(poVar2,"\" name=\"Node");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__range2);
      poVar2 = std::operator<<(poVar2,"\">");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)out,"            <instance_geometry url=\"#M");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,__range2._4_4_);
      poVar2 = std::operator<<(poVar2,"\">");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)out,"            </instance_geometry>");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)out,"         </node>");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  poVar2 = std::operator<<((ostream *)out,"      </visual_scene>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)out,"   </library_visual_scenes>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)out,"   <scene>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)out,"      <instance_visual_scene url=\"#ScottyScene\"/>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)out,"   </scene>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ColladaWriter::writeVisualScenes( ofstream& out, DynamicScene::Scene& scene )
{
   out << "   <library_visual_scenes>" << endl;
   out << "      <visual_scene id=\"ScottyScene\">" << endl;

   int nMeshes = 0;
   int nNodes = 0;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         nNodes++;
         out << "         <node id=\"N" << nNodes << "\" name=\"Node" << nNodes << "\">" << endl;
         out << "            <instance_geometry url=\"#M" << nMeshes << "\">" << endl;
         out << "            </instance_geometry>" << endl;
         out << "         </node>" << endl;
      }
   }

   out << "      </visual_scene>" << endl;
   out << "   </library_visual_scenes>" << endl;

   out << "   <scene>" << endl;
   out << "      <instance_visual_scene url=\"#ScottyScene\"/>" << endl;
   out << "   </scene>" << endl;
}